

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O2

ion_err_t flat_file_read_row(ion_flat_file_t *flat_file,ion_fpos_t location,ion_flat_file_row_t *row
                            )

{
  long lVar1;
  ion_byte_t *piVar2;
  int iVar3;
  long lVar4;
  ion_flat_file_row_status_t *piVar5;
  size_t sVar6;
  
  lVar1 = flat_file->current_loaded_region;
  lVar4 = location - lVar1;
  if ((location < lVar1 || lVar1 == -1) ||
     (lVar1 + flat_file->num_in_buffer <= (location & 0xffffffffU))) {
    iVar3 = fseek((FILE *)flat_file->data_file,
                  location * flat_file->row_size + flat_file->start_of_data,0);
    if (iVar3 != 0) {
      return '\r';
    }
    sVar6 = fread(flat_file->buffer,1,1,(FILE *)flat_file->data_file);
    if (sVar6 != 1) {
      return '\a';
    }
    sVar6 = fread(flat_file->buffer + 1,(long)(flat_file->super).record.key_size,1,
                  (FILE *)flat_file->data_file);
    if (sVar6 != 1) {
      return '\a';
    }
    sVar6 = fread(flat_file->buffer + (long)(flat_file->super).record.key_size + 1,
                  (long)(flat_file->super).record.value_size,1,(FILE *)flat_file->data_file);
    if (sVar6 != 1) {
      return '\a';
    }
    lVar4 = 0;
  }
  piVar2 = flat_file->buffer;
  lVar4 = lVar4 * flat_file->row_size;
  piVar5 = piVar2 + lVar4;
  row->row_status = *piVar5;
  row->key = piVar5 + 1;
  row->value = piVar2 + (flat_file->super).record.key_size + lVar4 + 1;
  return '\0';
}

Assistant:

ion_err_t
flat_file_read_row(
	ion_flat_file_t		*flat_file,
	ion_fpos_t			location,
	ion_flat_file_row_t *row
) {
	ion_fpos_t read_index = 0;

	if ((flat_file->current_loaded_region != -1) && (location >= flat_file->current_loaded_region) && ((unsigned) location < flat_file->current_loaded_region + flat_file->num_in_buffer)) {
		/* Cache hit, return directly from buffer */
		read_index = location - flat_file->current_loaded_region;
	}
	else {
		/* Cache miss, have to re-read from file */
		if (0 != fseek(flat_file->data_file, flat_file->start_of_data + location * flat_file->row_size, SEEK_SET)) {
			return err_file_bad_seek;
		}

		if (1 != fread(flat_file->buffer, sizeof(row->row_status), 1, flat_file->data_file)) {
			return err_file_write_error;
		}

		if (1 != fread(flat_file->buffer + sizeof(row->row_status), flat_file->super.record.key_size, 1, flat_file->data_file)) {
			return err_file_write_error;
		}

		if (1 != fread(flat_file->buffer + sizeof(row->row_status) + flat_file->super.record.key_size, flat_file->super.record.value_size, 1, flat_file->data_file)) {
			return err_file_write_error;
		}
	}

	row->row_status = *((ion_flat_file_row_status_t *) &flat_file->buffer[read_index * flat_file->row_size]);
	row->key		= &flat_file->buffer[read_index * flat_file->row_size + sizeof(ion_flat_file_row_status_t)];
	row->value		= &flat_file->buffer[read_index * flat_file->row_size + sizeof(ion_flat_file_row_status_t) + flat_file->super.record.key_size];

	return err_ok;
}